

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_set_column.h
# Opt level: O3

bool Gudhi::persistence_matrix::operator==
               (Unordered_set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>
                *c1,Unordered_set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>
                    *c2)

{
  __node_base_ptr p_Var1;
  __node_base *p_Var2;
  bool bVar3;
  Entry *entry;
  key_type local_30;
  
  if (c1 == c2) {
    bVar3 = true;
  }
  else if ((c1->column_)._M_h._M_element_count == (c2->column_)._M_h._M_element_count) {
    p_Var2 = &(c1->column_)._M_h._M_before_begin;
    do {
      p_Var2 = p_Var2->_M_nxt;
      bVar3 = p_Var2 == (__node_base *)0x0;
      if (bVar3) {
        return bVar3;
      }
      local_30 = *(key_type *)(p_Var2 + 1);
      p_Var1 = std::
               _Hashtable<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>_*,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>_*>,_std::__detail::_Identity,_Gudhi::persistence_matrix::EntryPointerEq<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>_>,_Gudhi::persistence_matrix::EntryPointerHash<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
               ::_M_find_before_node
                         (&(c2->column_)._M_h,
                          (ulong)*(uint *)&((_Hash_node_base *)((long)local_30 + 8))->_M_nxt %
                          (c2->column_)._M_h._M_bucket_count,&local_30,
                          (ulong)*(uint *)&((_Hash_node_base *)((long)local_30 + 8))->_M_nxt);
      if ((p_Var1 == (__node_base_ptr)0x0) || (p_Var1->_M_nxt == (_Hash_node_base *)0x0))
      goto LAB_0016f7a6;
    } while (*(uint *)((long)&(p_Var1->_M_nxt[1]._M_nxt)->_M_nxt + 4) ==
             (local_30->super_Entry_field_element_option).element_);
  }
  else {
LAB_0016f7a6:
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool operator==(const Unordered_set_column& c1, const Unordered_set_column& c2) {
    if (&c1 == &c2) return true;
    if (c1.column_.size() != c2.column_.size()) return false;

    for (Entry* entry : c1.column_) {
      auto it = c2.column_.find(entry);
      if (it == c2.column_.end()) return false;
      if constexpr (!Master_matrix::Option_list::is_z2)
        if ((*it)->get_element() != entry->get_element()) return false;
    }
    return true;
  }